

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O2

void __thiscall
TPZStack<MaterialDataV,_10>::Push(TPZStack<MaterialDataV,_10> *this,MaterialDataV *object)

{
  (*(this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>._vptr_TPZVec[3])
            (this,(this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>.
                  fNElements + 1);
  MaterialDataV::operator=
            ((this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>.fStore +
             (this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>.fNElements +
             -1,object);
  return;
}

Assistant:

void TPZStack<T, NumExtAlloc>::Push(const T object) {
	this->Resize(this->NElements()+1);
	this->operator[](this->NElements()-1) = object;
}